

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O2

int device_initialization(Init *init)

{
  VkDebugUtilsMessengerEXT pVVar1;
  VkAllocationCallbacks *pVVar2;
  PFN_vkGetInstanceProcAddr p_Var3;
  PFN_vkGetDeviceProcAddr p_Var4;
  uint32_t uVar5;
  uint32_t uVar6;
  bool bVar7;
  InstanceBuilder *pIVar8;
  Instance *pIVar9;
  PhysicalDevice *pPVar10;
  Device *pDVar11;
  ostream *poVar12;
  fd_set *in_RCX;
  fd_set *__readfds;
  int iVar13;
  fd_set *in_R8;
  timeval *in_R9;
  error_code eVar14;
  Result<vkb::Instance> instance_ret;
  InstanceBuilder instance_builder;
  PhysicalDeviceSelector phys_device_selector;
  Result<vkb::PhysicalDevice> phys_device_ret;
  Result<vkb::Device> device_ret;
  DispatchTable local_2818;
  PhysicalDevice local_1490;
  PhysicalDevice physical_device;
  DeviceBuilder device_builder;
  
  vkb::InstanceBuilder::InstanceBuilder(&instance_builder);
  pIVar8 = vkb::InstanceBuilder::use_default_debug_messenger(&instance_builder);
  pIVar8 = vkb::InstanceBuilder::request_validation_layers(pIVar8,true);
  pIVar8 = vkb::InstanceBuilder::set_headless(pIVar8,true);
  vkb::InstanceBuilder::build(&instance_ret,pIVar8);
  if (instance_ret.m_init == false) {
    eVar14 = vkb::Result<vkb::Instance>::error(&instance_ret);
    (**(code **)(*(long *)eVar14._M_cat + 0x20))(&local_2818,eVar14._M_cat,eVar14._M_value);
    poVar12 = std::operator<<((ostream *)&std::cout,(string *)&local_2818);
    std::operator<<(poVar12,"\n");
    std::__cxx11::string::~string((string *)&local_2818);
    iVar13 = -1;
  }
  else {
    pIVar9 = vkb::Result<vkb::Instance>::value(&instance_ret);
    pVVar1 = pIVar9->debug_messenger;
    pVVar2 = pIVar9->allocation_callbacks;
    p_Var3 = pIVar9->fp_vkGetInstanceProcAddr;
    p_Var4 = pIVar9->fp_vkGetDeviceProcAddr;
    uVar5 = pIVar9->instance_version;
    uVar6 = pIVar9->api_version;
    (init->instance).instance = pIVar9->instance;
    (init->instance).debug_messenger = pVVar1;
    (init->instance).allocation_callbacks = pVVar2;
    (init->instance).fp_vkGetInstanceProcAddr = p_Var3;
    (init->instance).fp_vkGetDeviceProcAddr = p_Var4;
    (init->instance).instance_version = uVar5;
    (init->instance).api_version = uVar6;
    bVar7 = pIVar9->properties2_ext_enabled;
    (init->instance).headless = pIVar9->headless;
    (init->instance).properties2_ext_enabled = bVar7;
    vkb::Instance::make_table((InstanceDispatchTable *)&local_2818,&init->instance);
    memcpy(&init->inst_disp,&local_2818,0x379);
    vkb::PhysicalDeviceSelector::PhysicalDeviceSelector(&phys_device_selector,&init->instance);
    vkb::PhysicalDeviceSelector::select
              ((PhysicalDeviceSelector *)&phys_device_ret,(int)&phys_device_selector,__readfds,
               in_RCX,in_R8,in_R9);
    if (phys_device_ret.m_init == false) {
      eVar14 = vkb::Result<vkb::PhysicalDevice>::error(&phys_device_ret);
      (**(code **)(*(long *)eVar14._M_cat + 0x20))(&local_2818,eVar14._M_cat,eVar14._M_value);
      poVar12 = std::operator<<((ostream *)&std::cout,(string *)&local_2818);
      std::operator<<(poVar12,"\n");
      std::__cxx11::string::~string((string *)&local_2818);
      iVar13 = -1;
    }
    else {
      pPVar10 = vkb::Result<vkb::PhysicalDevice>::value(&phys_device_ret);
      vkb::PhysicalDevice::PhysicalDevice(&physical_device,pPVar10);
      vkb::PhysicalDevice::PhysicalDevice(&local_1490,&physical_device);
      vkb::DeviceBuilder::DeviceBuilder(&device_builder,&local_1490);
      vkb::PhysicalDevice::~PhysicalDevice(&local_1490);
      vkb::DeviceBuilder::build(&device_ret,&device_builder);
      if (device_ret.m_init == false) {
        eVar14 = vkb::Result<vkb::Device>::error(&device_ret);
        (**(code **)(*(long *)eVar14._M_cat + 0x20))(&local_2818,eVar14._M_cat,eVar14._M_value);
        poVar12 = std::operator<<((ostream *)&std::cout,(string *)&local_2818);
        std::operator<<(poVar12,"\n");
        std::__cxx11::string::~string((string *)&local_2818);
        iVar13 = -1;
      }
      else {
        pDVar11 = vkb::Result<vkb::Device>::value(&device_ret);
        vkb::Device::operator=(&init->device,pDVar11);
        vkb::Device::make_table(&local_2818,&init->device);
        memcpy(&init->disp,&local_2818,0x1381);
        iVar13 = 0;
      }
      vkb::Result<vkb::Device>::destroy(&device_ret);
      vkb::DeviceBuilder::~DeviceBuilder(&device_builder);
      vkb::PhysicalDevice::~PhysicalDevice(&physical_device);
    }
    vkb::Result<vkb::PhysicalDevice>::destroy(&phys_device_ret);
    vkb::PhysicalDeviceSelector::SelectionCriteria::~SelectionCriteria
              (&phys_device_selector.criteria);
  }
  vkb::InstanceBuilder::InstanceInfo::~InstanceInfo(&instance_builder.info);
  return iVar13;
}

Assistant:

int device_initialization(Init& init) {
    vkb::InstanceBuilder instance_builder;
    auto instance_ret = instance_builder.use_default_debug_messenger()
                            .request_validation_layers()
                            .set_headless() // Skip vk-bootstrap trying to create WSI for you
                            .build();
    if (!instance_ret) {
        std::cout << instance_ret.error().message() << "\n";
        return -1;
    }
    init.instance = instance_ret.value();

    init.inst_disp = init.instance.make_table();

    vkb::PhysicalDeviceSelector phys_device_selector(init.instance);
    auto phys_device_ret = phys_device_selector.select();
    if (!phys_device_ret) {
        std::cout << phys_device_ret.error().message() << "\n";
        return -1;
    }
    vkb::PhysicalDevice physical_device = phys_device_ret.value();

    vkb::DeviceBuilder device_builder{ physical_device };
    auto device_ret = device_builder.build();
    if (!device_ret) {
        std::cout << device_ret.error().message() << "\n";
        return -1;
    }
    init.device = device_ret.value();

    init.disp = init.device.make_table();

    return 0;
}